

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

string * __thiscall
wabt::Decompiler::TempVarName_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this,Index n)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  size_type *psVar6;
  Index IVar7;
  string __str;
  char *local_40;
  uint local_38;
  char local_30 [16];
  
  cVar4 = '\x01';
  if (9 < n) {
    IVar7 = n;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (IVar7 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00155747;
      }
      if (IVar7 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00155747;
      }
      if (IVar7 < 10000) goto LAB_00155747;
      bVar1 = 99999 < IVar7;
      IVar7 = IVar7 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_00155747:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_40,local_38,n);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x17fdd1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TempVarName(Index n) {
    // FIXME: this needs much better variable naming. Problem is, the code
    // in generate-names.cc has allready run, its dictionaries deleted, so it
    // is not easy to integrate with it.
    return "t" + std::to_string(n);
  }